

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O2

bool __thiscall aiMetadata::Set<bool>(aiMetadata *this,uint index,string *key,bool *value)

{
  aiString *paVar1;
  ulong __n;
  aiString *paVar2;
  bool bVar3;
  undefined1 *puVar4;
  
  if (index < this->mNumProperties) {
    __n = key->_M_string_length;
    if (__n == 0) {
      bVar3 = false;
    }
    else {
      if (__n < 0x400) {
        paVar2 = this->mKeys;
        paVar1 = paVar2 + index;
        paVar1->length = (ai_uint32)__n;
        memcpy(paVar1->data,(key->_M_dataplus)._M_p,__n);
        paVar2[index].data[__n] = '\0';
      }
      this->mValues[index].mType = AI_BOOL;
      puVar4 = (undefined1 *)operator_new(1);
      *puVar4 = *value;
      this->mValues[index].mData = puVar4;
      bVar3 = true;
    }
    return bVar3;
  }
  return false;
}

Assistant:

inline 
    bool Set( unsigned index, const std::string& key, const T& value ) {
        // In range assertion
        if ( index >= mNumProperties ) {
            return false;
        }

        // Ensure that we have a valid key.
        if ( key.empty() ) {
            return false;
        }

        // Set metadata key
        mKeys[index] = key;

        // Set metadata type
        mValues[index].mType = GetAiType(value);
        // Copy the given value to the dynamic storage
        mValues[index].mData = new T(value);

        return true;
    }